

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::IsPlanar(ON_NurbsSurface *this,ON_Plane *plane,double tolerance)

{
  double t;
  bool bVar1;
  bool bVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_3dVector *this_00;
  int i;
  int iVar5;
  byte bVar6;
  double dVar7;
  ON_3dVector normal;
  ON_Interval vdom;
  ON_Interval udom;
  ON_3dVector dv;
  ON_3dVector du;
  ON_3dPoint center;
  ON_3dPoint cv;
  ON_Plane local_168;
  double local_e8;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  ON_Interval local_b0;
  ON_Interval local_a0;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar6 = 0;
  local_e8 = tolerance;
  ON_Plane::ON_Plane(&local_168);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
  dVar7 = ON_Interval::ParameterAt(&local_a0,0.5);
  t = ON_Interval::ParameterAt(&local_b0,0.5);
  bVar1 = ON_Surface::EvNormal
                    (&this->super_ON_Surface,dVar7,t,&local_60,&local_78,&local_90,&local_c8,0,
                     (int *)0x0);
  if (bVar1) {
    dVar7 = ON_3dVector::Length(&local_c8);
    if (dVar7 < 0.9) {
      bVar1 = false;
      goto LAB_0054d37e;
    }
  }
  local_168.origin.z = local_60.z;
  local_168.origin.x = local_60.x;
  local_168.origin.y = local_60.y;
  local_168.zaxis.x = local_c8.x;
  local_168.zaxis.y = local_c8.y;
  local_168.zaxis.z = local_c8.z;
  bVar2 = ON_3dVector::Unitize(&local_78);
  if (bVar2) {
    local_168.xaxis.z = local_78.z;
    local_168.xaxis.x = local_78.x;
    local_168.xaxis.y = local_78.y;
    ON_CrossProduct(&local_e0,&local_168.zaxis,&local_168.xaxis);
    this_00 = &local_168.yaxis;
    local_168.yaxis.z = local_e0.z;
    local_168.yaxis.x = local_e0.x;
    local_168.yaxis.y = local_e0.y;
LAB_0054d0f8:
    ON_3dVector::Unitize(this_00);
    ON_Plane::UpdateEquation(&local_168);
  }
  else {
    bVar2 = ON_3dVector::Unitize(&local_90);
    if (bVar2) {
      local_168.yaxis.z = local_90.z;
      local_168.yaxis.x = local_90.x;
      local_168.yaxis.y = local_90.y;
      ON_CrossProduct(&local_e0,&local_168.yaxis,&local_168.zaxis);
      this_00 = &local_168.xaxis;
      local_168.xaxis.z = local_e0.z;
      local_168.xaxis.x = local_e0.x;
      local_168.xaxis.y = local_e0.y;
      goto LAB_0054d0f8;
    }
    ON_Plane::CreateFromNormal(&local_168,&local_60,&local_c8);
  }
  dVar7 = ABS(local_168.zaxis.x);
  if (((2.3283064365386963e-10 < dVar7) || (2.3283064365386963e-10 < ABS(local_168.zaxis.y))) ||
     (1.490116119385e-08 < ABS(ABS(local_168.zaxis.z) + -1.0))) {
    if (((ABS(local_168.zaxis.y) <= 2.3283064365386963e-10) &&
        (ABS(local_168.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(dVar7 + -1.0) <= 1.490116119385e-08)) {
      local_168.xaxis.x = 0.0;
      local_168.yaxis.x = 0.0;
      local_168.zaxis.x = *(double *)(&DAT_006a8450 + (ulong)(local_168.zaxis.x < 0.0) * 8);
      local_168.zaxis.y = 0.0;
      local_168.zaxis.z = 0.0;
      goto LAB_0054d2c4;
    }
    if (((dVar7 <= 2.3283064365386963e-10) && (ABS(local_168.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(ABS(local_168.zaxis.y) + -1.0) <= 1.490116119385e-08)) {
      local_168.xaxis.y = 0.0;
      local_168.yaxis.y = 0.0;
      local_168.zaxis.z = 0.0;
      local_168.zaxis.x = 0.0;
      local_168.zaxis.y = *(double *)(&DAT_006a8450 + (ulong)(local_168.zaxis.y < 0.0) * 8);
      goto LAB_0054d2c4;
    }
  }
  else {
    local_168.xaxis.z = 0.0;
    local_168.zaxis.z = *(double *)(&DAT_006a8450 + (ulong)(local_168.zaxis.z < 0.0) * 8);
    local_168.yaxis.z = 0.0;
    local_168.zaxis.x = 0.0;
    local_168.zaxis.y = 0.0;
LAB_0054d2c4:
    ON_Plane::UpdateEquation(&local_168);
  }
  if (bVar1 && 0 < this->m_cv_count[0]) {
    i = 0;
    do {
      if ((0 < this->m_cv_count[1]) && (bVar1 != false)) {
        iVar5 = 1;
        do {
          GetCV(this,i,iVar5 + -1,&local_48);
          dVar7 = ON_Plane::DistanceTo(&local_168,&local_48);
          if (local_e8 < ABS(dVar7)) {
            bVar1 = false;
          }
        } while ((iVar5 < this->m_cv_count[1]) && (iVar5 = iVar5 + 1, bVar1 != false));
      }
      i = i + 1;
    } while ((i < this->m_cv_count[0]) && (bVar1 != false));
  }
  if ((plane != (ON_Plane *)0x0) && (bVar1 != false)) {
    pOVar4 = &local_168;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (plane->origin).x = (pOVar4->origin).x;
      pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      plane = (ON_Plane *)((long)plane + (ulong)bVar6 * -0x10 + 8);
    }
  }
LAB_0054d37e:
  ON_Plane::~ON_Plane(&local_168);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  ON_Plane pln;
  double d;
  ON_3dPoint center, cv;
  ON_3dVector normal, du, dv;
  ON_Interval udom = Domain(0);
  ON_Interval vdom = Domain(1);
  bool rc = EvNormal( udom.ParameterAt(0.5), vdom.ParameterAt(0.5), center, du, dv, normal );
  if ( rc && normal.Length() < 0.9 )
    rc = false;
  else
  {
    pln.origin = center;
    pln.zaxis = normal;
    if ( du.Unitize() )
    {
      pln.xaxis = du;
      pln.yaxis = ON_CrossProduct( pln.zaxis, pln.xaxis );
      pln.yaxis.Unitize();
      pln.UpdateEquation();
    }
    else if ( dv.Unitize() )
    {
      pln.yaxis = dv;
      pln.xaxis = ON_CrossProduct( pln.yaxis, pln.zaxis );
      pln.xaxis.Unitize();
      pln.UpdateEquation();
    }
    else
    {
      pln.CreateFromNormal( center, normal );
    }

    // 7 July 2006 Dale Lear
    //    Add a slight bias for coordinate axes planes.
    //    This appears to do more good than harm.  The
    //    issue is keeping customers from getting alarmed
    //    when a coordinate they know is "zero" turns out to
    //    be 1e-23.
    if (    fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE 
         && fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE
         && fabs(fabs(pln.zaxis.z)-1.0) <= ON_SQRT_EPSILON
       )
    {
      pln.xaxis.z = 0.0;
      pln.yaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = (pln.zaxis.z<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.x)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.x = 0.0;
      pln.yaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = (pln.zaxis.x<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.y)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.y = 0.0;
      pln.yaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = (pln.zaxis.y<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }

    int i, j;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      for ( j = 0; j < m_cv_count[1] && rc; j++ )
      {
        GetCV( i, j, cv );
        d = pln.DistanceTo(cv);
        if ( fabs(d) > tolerance )
          rc = false;
      }
    }

    if ( rc && plane )
      *plane = pln;
  }

  return rc;
}